

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::removeCenterAnchors
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint centerEdge,
          bool substitute)

{
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *this_00;
  QGraphicsLayoutItem *pQVar1;
  Data *this_01;
  bool bVar2;
  AnchorPoint firstEdge;
  AnchorVertex *second;
  AnchorVertex *first;
  AnchorData *pAVar3;
  Node<QSimplexVariable_*,_double> *pNVar4;
  QSimplexConstraint *this_02;
  uint uVar5;
  byte bVar6;
  AnchorPoint secondEdge;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_03;
  long lVar7;
  QGraphicsLayoutItem *pQVar8;
  ulong i;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar10;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_68;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  if (centerEdge == AnchorHorizontalCenter) {
    bVar6 = 1;
    lVar7 = 0;
  }
  else {
    if (centerEdge != AnchorVerticalCenter) goto LAB_005ccc9e;
    lVar7 = 1;
    bVar6 = 0;
  }
  local_68.d.ptr = (AnchorVertex **)CONCAT44(local_68.d.ptr._4_4_,centerEdge);
  this_00 = &this->m_vertexList;
  local_68.d.d = (Data *)item;
  pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
           ::value(this_00,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_68);
  second = pVar10.first;
  if (second != (AnchorVertex *)0x0) {
    bVar6 = bVar6 ^ 1;
    firstEdge = (uint)bVar6 + (uint)bVar6 * 2;
    local_68.d.ptr = (AnchorVertex **)CONCAT44(local_68.d.ptr._4_4_,firstEdge);
    local_68.d.d = (Data *)item;
    pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
             ::value(this_00,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_68);
    first = pVar10.first;
    this_03 = (this->graph).m_data + lVar7;
    pAVar3 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_03,first,second);
    uVar5 = (int)(this->itemCenterConstraints).m_data[lVar7].d.size - 1;
    if (-1 < (int)uVar5) {
      pQVar8 = (QGraphicsLayoutItem *)&pAVar3->super_QSimplexVariable;
      if (pAVar3 == (AnchorData *)0x0) {
        pQVar8 = (QGraphicsLayoutItem *)0x0;
      }
      i = (ulong)uVar5;
      do {
        this_01 = ((this->itemCenterConstraints).m_data[lVar7].d.ptr[i]->variables).d;
        local_68.d.d = (Data *)pQVar8;
        if ((this_01 != (Data *)0x0) &&
           (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::
                     findNode<QSimplexVariable*>
                               ((Data<QHashPrivate::Node<QSimplexVariable*,double>> *)this_01,
                                (QSimplexVariable **)&local_68),
           pNVar4 != (Node<QSimplexVariable_*,_double> *)0x0)) {
          this_02 = QList<QSimplexConstraint_*>::takeAt
                              ((this->itemCenterConstraints).m_data + lVar7,i);
          if (this_02 != (QSimplexConstraint *)0x0) {
            QHash<QSimplexVariable_*,_double>::~QHash(&this_02->variables);
            operator_delete(this_02,0x30);
          }
          break;
        }
        bVar2 = 0 < (long)i;
        i = i - 1;
      } while (bVar2);
    }
    secondEdge = (uint)bVar6 * 3 + AnchorRight;
    if (substitute) {
      pAVar3 = (AnchorData *)operator_new(0x80);
      (pAVar3->super_QSimplexVariable).result = 0.0;
      (pAVar3->super_QSimplexVariable).index = 0;
      pAVar3->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_0081f120;
      pAVar3->from = (AnchorVertex *)0x0;
      pAVar3->to = (AnchorVertex *)0x0;
      pAVar3->minSize = 0.0;
      pAVar3->prefSize = 0.0;
      pAVar3->maxSize = 0.0;
      pAVar3->minPrefSize = 0.0;
      pAVar3->maxPrefSize = 0.0;
      pAVar3->sizeAtMinimum = 0.0;
      pAVar3->sizeAtPreferred = 0.0;
      pAVar3->sizeAtMaximum = 0.0;
      pAVar3->item = (QGraphicsLayoutItem *)0x0;
      pAVar3->graphicsAnchor = (QGraphicsAnchor *)0x0;
      pAVar3->field_0x78 = pAVar3->field_0x78 & 0x80;
      addAnchor_helper(this,item,firstEdge,item,secondEdge,pAVar3);
      QtGraphicsAnchorLayout::AnchorData::refreshSizeHints(pAVar3,(QLayoutStyleInfo *)0x0);
      removeAnchor_helper(this,first,second);
      local_68.d.ptr = (AnchorVertex **)CONCAT44(local_68.d.ptr._4_4_,secondEdge);
      local_68.d.d = (Data *)item;
      pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
               ::value(this_00,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_68);
      removeAnchor_helper(this,second,pVar10.first);
    }
    else {
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(&local_68,this_03,second);
      if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
        puVar9 = (undefined1 *)0x0;
        do {
          local_48.first = local_68.d.ptr[(long)puVar9]->m_item;
          if (local_48.first != item) {
            local_48.second = local_68.d.ptr[(long)puVar9]->m_edge;
            pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                     ::value(this_00,&local_48);
            removeAnchor_helper(this,second,pVar10.first);
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 < (ulong)local_68.d.size);
      }
      local_48.first = item;
      local_48.second = secondEdge;
      pVar10 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
               ::value(this_00,&local_48);
      removeAnchor_helper(this,first,pVar10.first);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    if (pQVar1 == item) {
      (this->layoutCentralVertex).m_data[lVar7] = (AnchorVertex *)0x0;
    }
  }
LAB_005ccc9e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeCenterAnchors(
    QGraphicsLayoutItem *item, Qt::AnchorPoint centerEdge,
    bool substitute)
{
    Q_Q(QGraphicsAnchorLayout);

    Qt::Orientation orientation;
    switch (centerEdge) {
    case Qt::AnchorHorizontalCenter:
        orientation = Qt::Horizontal;
        break;
    case Qt::AnchorVerticalCenter:
        orientation = Qt::Vertical;
        break;
    default:
        // Don't remove edges that not the center ones
        return;
    }

    // Orientation code
    Qt::AnchorPoint firstEdge;
    Qt::AnchorPoint lastEdge;

    if (orientation == Qt::Horizontal) {
        firstEdge = Qt::AnchorLeft;
        lastEdge = Qt::AnchorRight;
    } else {
        firstEdge = Qt::AnchorTop;
        lastEdge = Qt::AnchorBottom;
    }

    AnchorVertex *center = internalVertex(item, centerEdge);
    if (!center)
        return;
    AnchorVertex *first = internalVertex(item, firstEdge);

    Q_ASSERT(first);
    Q_ASSERT(center);

    Graph<AnchorVertex, AnchorData> &g = graph[orientation];


    AnchorData *oldData = g.edgeData(first, center);
    // Remove center constraint
    for (int i = itemCenterConstraints[orientation].size() - 1; i >= 0; --i) {
        if (itemCenterConstraints[orientation].at(i)->variables.contains(oldData)) {
            delete itemCenterConstraints[orientation].takeAt(i);
            break;
        }
    }

    if (substitute) {
        // Create the new anchor that should substitute the left-center-right anchors.
        AnchorData *data = new AnchorData;
        addAnchor_helper(item, firstEdge, item, lastEdge, data);
        data->refreshSizeHints();

        // Remove old anchors
        removeAnchor_helper(first, center);
        removeAnchor_helper(center, internalVertex(item, lastEdge));

    } else {
        // this is only called from removeAnchors()
        // first, remove all non-internal anchors
        QList<AnchorVertex*> adjacents = g.adjacentVertices(center);
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *v = adjacents.at(i);
            if (v->m_item != item) {
                removeAnchor_helper(center, internalVertex(v->m_item, v->m_edge));
            }
        }
        // when all non-internal anchors is removed it will automatically merge the
        // center anchor into a left-right (or top-bottom) anchor. We must also delete that.
        // by this time, the center vertex is deleted and merged into a non-centered internal anchor
        removeAnchor_helper(first, internalVertex(item, lastEdge));
    }

    if (item == q) {
        layoutCentralVertex[orientation] = nullptr;
    }
}